

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O3

void __thiscall cursespp::Window::SetFrameVisible(Window *this,bool enabled)

{
  if ((this->drawFrame != enabled) &&
     (this->drawFrame = enabled, this->content != (WINDOW *)0x0 || this->frame != (WINDOW *)0x0)) {
    (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x30])(this);
    (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x2b])(this);
    return;
  }
  return;
}

Assistant:

void Window::SetFrameVisible(bool enabled) {
    ASSERT_MAIN_THREAD();

    if (enabled != this->drawFrame) {
        this->drawFrame = enabled;

        if (this->frame || this->content) {
            this->Destroy();
            this->Show();
        }
    }
}